

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O0

int Gia_PolynHandleOne(Hsh_VecMan_t *pHashC,Hsh_VecMan_t *pHashM,Vec_Int_t *vCoefs,
                      Vec_Wec_t *vLit2Mono,Vec_Int_t *vTempC,Vec_Int_t *vTempM,int iMono,int iLitOld
                      ,int iLitNew0,int iLitNew1)

{
  int iVar1;
  Vec_Int_t *vVec2;
  Vec_Int_t *vVec2_00;
  Vec_Int_t *vArrayM;
  Vec_Int_t *vArrayC;
  int iConst;
  int status;
  Vec_Int_t *vTempM_local;
  Vec_Int_t *vTempC_local;
  Vec_Wec_t *vLit2Mono_local;
  Vec_Int_t *vCoefs_local;
  Hsh_VecMan_t *pHashM_local;
  Hsh_VecMan_t *pHashC_local;
  
  iVar1 = Vec_IntEntry(vCoefs,iMono);
  vVec2 = Hsh_VecReadEntry(pHashC,iVar1);
  vVec2_00 = Hsh_VecReadEntry(pHashM,iMono);
  Vec_IntClear(vTempM);
  Vec_IntAppend(vTempM,vVec2_00);
  iVar1 = Vec_IntRemove(vTempM,iLitOld);
  if (iVar1 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPo.c"
                  ,0x1ed,
                  "int Gia_PolynHandleOne(Hsh_VecMan_t *, Hsh_VecMan_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                 );
  }
  if ((iLitNew0 == -1) && (iLitNew1 == -1)) {
    Vec_IntAppendMinusAbs(vTempC,vVec2,0);
  }
  else if ((iLitNew0 < 0) || (iLitNew1 != -1)) {
    if ((iLitNew0 < 0) || (iLitNew1 < 0)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPo.c"
                    ,0x1fc,
                    "int Gia_PolynHandleOne(Hsh_VecMan_t *, Hsh_VecMan_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                   );
    }
    Vec_IntAppendMinusAbs(vTempC,vVec2,0);
    Vec_IntPushUniqueOrder(vTempM,iLitNew0);
    Vec_IntPushUniqueOrder(vTempM,iLitNew1);
  }
  else {
    Vec_IntAppendMinusAbs(vTempC,vVec2,1);
    Vec_IntPushUniqueOrder(vTempM,iLitNew0);
  }
  iVar1 = Gia_PolynBuildAdd(pHashC,pHashM,vCoefs,vLit2Mono,vTempC,vTempM);
  return iVar1;
}

Assistant:

static inline int Gia_PolynHandleOne( Hsh_VecMan_t * pHashC, Hsh_VecMan_t * pHashM, Vec_Int_t * vCoefs, 
                                      Vec_Wec_t * vLit2Mono, Vec_Int_t * vTempC, Vec_Int_t * vTempM, 
                                      int iMono, int iLitOld, int iLitNew0, int iLitNew1 )
{
    int status, iConst = Vec_IntEntry( vCoefs, iMono );
    Vec_Int_t * vArrayC = Hsh_VecReadEntry( pHashC, iConst );
    Vec_Int_t * vArrayM = Hsh_VecReadEntry( pHashM, iMono );
    // create new monomial
    Vec_IntClear( vTempM );
    Vec_IntAppend( vTempM, vArrayM );
    status = Vec_IntRemove( vTempM, iLitOld );
    assert( status );
    // create new monomial
    if ( iLitNew0 == -1 && iLitNew1 == -1 )     // no new lit - the same const
        Vec_IntAppendMinusAbs( vTempC, vArrayC, 0 );
    else if ( iLitNew0 > -1 && iLitNew1 == -1 ) // one new lit - opposite const
    {
        Vec_IntAppendMinusAbs( vTempC, vArrayC, 1 );
        Vec_IntPushUniqueOrder( vTempM, iLitNew0 );
    }
    else if ( iLitNew0 > -1 && iLitNew1 > -1 )  // both new lit - the same const
    {
        Vec_IntAppendMinusAbs( vTempC, vArrayC, 0 );
        Vec_IntPushUniqueOrder( vTempM, iLitNew0 );
        Vec_IntPushUniqueOrder( vTempM, iLitNew1 );
    }
    else assert( 0 );
    return Gia_PolynBuildAdd( pHashC, pHashM, vCoefs, vLit2Mono, vTempC, vTempM );
}